

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O2

QStringList * QGenericUnixTheme::iconFallbackPaths(void)

{
  char cVar1;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QFileInfo pixmapsIconsDir;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = 0;
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr = (char16_t *)0x0;
  local_48.ptr = L"/usr/share/pixmaps";
  local_60.size = 0;
  local_48.size = 0x12;
  QFileInfo::QFileInfo((QFileInfo *)&local_30,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  cVar1 = QFileInfo::isDir();
  if (cVar1 != '\0') {
    QFileInfo::absoluteFilePath();
    QList<QString>::emplaceBack<QString>(in_RDI,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QGenericUnixTheme::iconFallbackPaths()
{
    QStringList paths;
    const QFileInfo pixmapsIconsDir(QStringLiteral("/usr/share/pixmaps"));
    if (pixmapsIconsDir.isDir())
        paths.append(pixmapsIconsDir.absoluteFilePath());

    return paths;
}